

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O3

bool __thiscall
re2::EmptyStringWalker::PostVisit
          (EmptyStringWalker *this,Regexp *re,bool parent_arg,bool pre_arg,bool *child_args,
          int nchild_args)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = false;
  switch(re->op_) {
  case '\x02':
  case '\a':
  case '\t':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x15':
    break;
  default:
    goto switchD_00126cbb_caseD_3;
  case '\x05':
    if (0 < nchild_args) {
      uVar2 = 0;
      do {
        if (child_args[uVar2] == false) {
          return false;
        }
        uVar2 = uVar2 + 1;
      } while ((uint)nchild_args != uVar2);
      return (uint)nchild_args <= uVar2;
    }
    break;
  case '\x06':
    if (nchild_args < 1) {
      return false;
    }
    uVar2 = 0;
    while (child_args[uVar2] == false) {
      uVar2 = uVar2 + 1;
      if ((uint)nchild_args == uVar2) {
        return uVar2 < (uint)nchild_args;
      }
    }
    break;
  case '\b':
  case '\v':
    return *child_args;
  case '\n':
    bVar1 = true;
    if (*child_args == false) {
      return (re->field_7).field_0.min_ == 0;
    }
    goto switchD_00126cbb_caseD_3;
  }
  bVar1 = true;
switchD_00126cbb_caseD_3:
  return bVar1;
}

Assistant:

RegexpOp op() { return static_cast<RegexpOp>(op_); }